

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_starter_test.cpp
# Opt level: O0

int main(void)

{
  test_location<void_(*)()> test;
  int iVar1;
  source_location sVar2;
  SubdirectoryDisposer directory;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff18;
  test_location<void_(*)()> *in_stack_ffffffffffffff20;
  allocator<char> *name;
  allocator<char> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  allocator<char> local_41 [65];
  
  name = local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(local_41);
  sVar2 = boost::ext::ut::v1_1_8::reflection::source_location::current(in_stack_ffffffffffffff08,0);
  iVar1 = sVar2.line_;
  boost::ext::ut::v1_1_8::detail::test_location<void(*)()>::test_location<main::__0>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (source_location *)in_stack_ffffffffffffff10);
  boost::ext::ut::v1_1_8::literals::operator____test
            ((char *)name,(unsigned_long)in_stack_ffffffffffffff20);
  test.location.file_ = (char *)in_stack_ffffffffffffff98;
  test.test = (_func_void *)in_stack_ffffffffffffff90;
  test.location._8_8_ = in_stack_ffffffffffffffa0;
  boost::ext::ut::v1_1_8::detail::test::operator=<>
            ((test *)CONCAT44(in_stack_ffffffffffffff84,iVar1),test);
  boost::ext::ut::v1_1_8::detail::test::~test((test *)0x10bed5);
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer
            ((SubdirectoryDisposer *)in_stack_ffffffffffffff20);
  return 0;
}

Assistant:

int main()
{
    using namespace boost::ut;
    using namespace ApprovalTests;

    // This puts "received" and "approved" files in approval_tests/ sub-directory,
    // keeping the test source directory tidy:
    auto directory = Approvals::useApprovalsSubdirectory("approval_tests");

    "Starter"_test = []() {
        // TODO Replace 42 with the value or object whose contents you are verifying.
        // For help, see:
        // https://approvaltestscpp.readthedocs.io/en/latest/generated_docs/ToString.html
        Approvals::verify(42);
    };
}